

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataQueryDatumSpecification.cpp
# Opt level: O2

int __thiscall
DIS::DataQueryDatumSpecification::getMarshalledSize(DataQueryDatumSpecification *this)

{
  pointer pUVar1;
  int iVar2;
  int iVar3;
  unsigned_long_long idx;
  ulong uVar4;
  long lVar5;
  UnsignedDISInteger listElement;
  
  iVar3 = 8;
  lVar5 = 8;
  for (uVar4 = 0;
      pUVar1 = (this->_fixedDatumIDList).
               super__Vector_base<DIS::UnsignedDISInteger,_std::allocator<DIS::UnsignedDISInteger>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar4 < (ulong)((long)(this->_fixedDatumIDList).
                            super__Vector_base<DIS::UnsignedDISInteger,_std::allocator<DIS::UnsignedDISInteger>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar1 >> 4);
      uVar4 = uVar4 + 1) {
    listElement._vptr_UnsignedDISInteger = (_func_int **)&PTR__UnsignedDISInteger_001c35e0;
    listElement._val = *(uint *)((long)&pUVar1->_vptr_UnsignedDISInteger + lVar5);
    iVar2 = UnsignedDISInteger::getMarshalledSize(&listElement);
    iVar3 = iVar3 + iVar2;
    UnsignedDISInteger::~UnsignedDISInteger(&listElement);
    lVar5 = lVar5 + 0x10;
  }
  lVar5 = 8;
  uVar4 = 0;
  while( true ) {
    pUVar1 = (this->_variableDatumIDList).
             super__Vector_base<DIS::UnsignedDISInteger,_std::allocator<DIS::UnsignedDISInteger>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->_variableDatumIDList).
                      super__Vector_base<DIS::UnsignedDISInteger,_std::allocator<DIS::UnsignedDISInteger>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar1 >> 4) <= uVar4)
    break;
    listElement._vptr_UnsignedDISInteger = (_func_int **)&PTR__UnsignedDISInteger_001c35e0;
    listElement._val = *(uint *)((long)&pUVar1->_vptr_UnsignedDISInteger + lVar5);
    iVar2 = UnsignedDISInteger::getMarshalledSize(&listElement);
    iVar3 = iVar3 + iVar2;
    UnsignedDISInteger::~UnsignedDISInteger(&listElement);
    uVar4 = uVar4 + 1;
    lVar5 = lVar5 + 0x10;
  }
  return iVar3;
}

Assistant:

int DataQueryDatumSpecification::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = marshalSize + 4;  // _numberOfFixedDatums
   marshalSize = marshalSize + 4;  // _numberOfVariableDatums

   for(unsigned long long idx=0; idx < _fixedDatumIDList.size(); idx++)
   {
        UnsignedDISInteger listElement = _fixedDatumIDList[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }


   for(unsigned long long idx=0; idx < _variableDatumIDList.size(); idx++)
   {
        UnsignedDISInteger listElement = _variableDatumIDList[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }

    return marshalSize;
}